

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::emit_create_handle_for_lib_instruction(Impl *impl,CallInst *instruction)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  Value *pVVar5;
  _Hash_node_base *p_Var6;
  __hash_code __code;
  ulong uVar7;
  _Node_iterator_base<const_LLVMBC::CallInst_*,_false> __it;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  CallInst *local_28;
  
  local_28 = instruction;
  sVar3 = std::
          _Hashtable<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(impl->llvm_annotate_handle_lib_uses)._M_h,(key_type *)&local_28);
  bVar2 = true;
  if (sVar3 == 0) {
    local_28 = instruction;
    if (((impl->options).descriptor_qa_enabled == true) &&
       ((impl->options).descriptor_qa_sink_handles == true)) {
      sVar4 = std::
              _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(impl->resource_handles_needing_sink)._M_h,&local_28);
      if (sVar4 != 0) {
        uVar1 = (impl->resource_handles_needing_sink)._M_h._M_bucket_count;
        uVar7 = (ulong)instruction % uVar1;
        p_Var8 = (impl->resource_handles_needing_sink)._M_h._M_buckets[uVar7];
        p_Var9 = (__node_base_ptr)0x0;
        if ((p_Var8 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var8->_M_nxt, p_Var9 = p_Var8,
           (CallInst *)p_Var8->_M_nxt[1]._M_nxt != instruction)) {
          while (p_Var8 = p_Var6, p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var9 = (__node_base_ptr)0x0;
            if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar7) ||
               (p_Var9 = p_Var8, (CallInst *)p_Var6[1]._M_nxt == instruction)) goto LAB_00160a0f;
          }
          p_Var9 = (__node_base_ptr)0x0;
        }
LAB_00160a0f:
        if (p_Var9 == (__node_base_ptr)0x0) {
          __it._M_cur = (__node_type *)0x0;
        }
        else {
          __it._M_cur = (__node_type *)p_Var9->_M_nxt;
        }
        std::
        _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::erase(&(impl->resource_handles_needing_sink)._M_h,(const_iterator)__it._M_cur);
        return true;
      }
    }
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    uVar1 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_bucket_count;
    uVar7 = (ulong)pVVar5 % uVar1;
    p_Var8 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_buckets[uVar7];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var8->_M_nxt, p_Var9 = p_Var8, pVVar5 != (Value *)p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var6, p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar7) ||
           (p_Var9 = p_Var8, pVVar5 == (Value *)p_Var6[1]._M_nxt)) goto LAB_001609d8;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_001609d8:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var9->_M_nxt;
    }
    if (p_Var6 == (_Hash_node_base *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = emit_create_handle(impl,instruction,*(ResourceType *)&p_Var6[2]._M_nxt,
                                 *(uint *)((long)&p_Var6[2]._M_nxt + 4),(Value *)p_Var6[3]._M_nxt,
                                 *(bool *)&p_Var6[5]._M_nxt);
    }
  }
  return bVar2;
}

Assistant:

bool emit_create_handle_for_lib_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Defer creating any handles since annotateHandle is actually going to do it.
	if (impl.llvm_annotate_handle_lib_uses.count(instruction))
		return true;

	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(instruction->getOperand(1));
	if (itr == impl.llvm_global_variable_to_resource_mapping.end())
		return false;

	return emit_create_handle(impl, instruction, itr->second.type,
	                          itr->second.meta_index, itr->second.offset, itr->second.non_uniform);
}